

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotStairsEx<ImPlot::GetterFuncPtr>(char *label_id,GetterFuncPtr *getter)

{
  float fVar1;
  undefined8 uVar2;
  ImPlotRange IVar3;
  int iVar4;
  uint uVar5;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar6;
  undefined1 auVar7 [16];
  ImPlotContext *pIVar8;
  bool bVar9;
  ImU32 col;
  ImPlotContext *pIVar10;
  ImU32 col_00;
  undefined8 in_R8;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  undefined4 extraout_XMM0_Dc;
  ImPlotPoint IVar28;
  undefined4 extraout_XMM0_Dd;
  float in_XMM1_Da;
  float in_XMM1_Db;
  double dVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 in_XMM1_Dc;
  undefined4 uVar22;
  undefined4 in_XMM1_Dd;
  double dVar23;
  undefined4 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 local_98 [24];
  uint local_80;
  uint local_7c;
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  void *local_58;
  _func_ImPlotPoint_void_ptr_int *local_50;
  ImPlotPoint local_48;
  
  bVar9 = BeginItem(label_id,0);
  col_00 = (ImU32)in_R8;
  if (bVar9) {
    pIVar10 = GImPlot;
    if ((GImPlot->FitThisFrame == true) && (iVar4 = getter->Count, 0 < iVar4)) {
      iVar12 = 0;
      do {
        IVar28.x = (*getter->Getter)(getter->Data,
                                     ((getter->Offset + iVar12) % iVar4 + iVar4) % iVar4);
        pIVar10 = GImPlot;
        col_00 = (ImU32)in_R8;
        pIVar6 = GImPlot->CurrentPlot;
        iVar4 = pIVar6->CurrentYAxis;
        uVar5 = (pIVar6->XAxis).Flags;
        if ((uVar5 >> 10 & 1) == 0) {
          if (((ulong)IVar28.x & 0x7fffffffffffffff) < 0x7ff0000000000000) {
LAB_0024c1f5:
            if ((0.0 < (double)IVar28.x) || ((uVar5 & 0x20) == 0)) {
              dVar19 = (GImPlot->ExtentsX).Min;
              dVar23 = (GImPlot->ExtentsX).Max;
              uVar13 = -(ulong)((double)IVar28.x < dVar19);
              uVar15 = -(ulong)(dVar23 < (double)IVar28.x);
              auVar25._0_8_ = (ulong)IVar28.x & uVar13;
              auVar25._8_8_ = (ulong)IVar28.x & uVar15;
              auVar27._0_8_ = ~uVar13 & (ulong)dVar19;
              auVar27._8_8_ = ~uVar15 & (ulong)dVar23;
              GImPlot->ExtentsX = (ImPlotRange)(auVar27 | auVar25);
            }
          }
        }
        else if (((((ulong)IVar28.x & 0x7fffffffffffffff) < 0x7ff0000000000000) &&
                 (pIVar6->YAxis[iVar4].Range.Min <= (double)CONCAT44(in_XMM1_Db,in_XMM1_Da))) &&
                ((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) <= pIVar6->YAxis[iVar4].Range.Max))
        goto LAB_0024c1f5;
        uVar5 = pIVar6->YAxis[iVar4].Flags;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((CONCAT44(in_XMM1_Db,in_XMM1_Da) & 0x7fffffffffffffff) < 0x7ff0000000000000) {
LAB_0024c272:
            if ((0.0 < (double)CONCAT44(in_XMM1_Db,in_XMM1_Da)) || ((uVar5 & 0x20) == 0)) {
              IVar3 = pIVar10->ExtentsY[iVar4];
              dVar19 = IVar3.Min;
              dVar23 = IVar3.Max;
              uVar14 = -(ulong)((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) < dVar19);
              uVar16 = -(ulong)(dVar23 < (double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
              uVar13 = CONCAT44(in_XMM1_Db,in_XMM1_Da) & uVar14;
              uVar15 = CONCAT44(in_XMM1_Db,in_XMM1_Da) & uVar16;
              in_XMM1_Dc = (undefined4)uVar15;
              in_XMM1_Dd = (undefined4)(uVar15 >> 0x20);
              auVar26._0_8_ = ~uVar14 & (ulong)dVar19;
              auVar26._8_8_ = ~uVar16 & (ulong)dVar23;
              auVar7._8_4_ = in_XMM1_Dc;
              auVar7._0_8_ = uVar13;
              auVar7._12_4_ = in_XMM1_Dd;
              pIVar10->ExtentsY[iVar4] = (ImPlotRange)(auVar26 | auVar7);
              in_XMM1_Da = (float)uVar13;
              in_XMM1_Db = (float)(uVar13 >> 0x20);
            }
          }
        }
        else if ((((CONCAT44(in_XMM1_Db,in_XMM1_Da) & 0x7fffffffffffffff) < 0x7ff0000000000000) &&
                 ((pIVar6->XAxis).Range.Min <= (double)IVar28.x)) &&
                ((double)IVar28.x <= (pIVar6->XAxis).Range.Max)) goto LAB_0024c272;
        iVar12 = iVar12 + 1;
        iVar4 = getter->Count;
      } while (iVar12 < iVar4);
    }
    local_98._16_8_ = GetPlotDrawList();
    if ((1 < getter->Count) && ((pIVar10->NextItemData).RenderLine == true)) {
      col = ImGui::GetColorU32((pIVar10->NextItemData).Colors);
      iVar4 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar4]) {
      case 0:
        local_98._0_4_ = iVar4;
        RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>
                  ((ImPlot *)getter,(GetterFuncPtr *)local_98,(TransformerLinLin *)local_98._16_8_,
                   (ImDrawList *)(ulong)col,(pIVar10->NextItemData).LineWeight,col_00);
        break;
      case 1:
        local_98._0_4_ = iVar4;
        RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLogLin>
                  ((ImPlot *)getter,(GetterFuncPtr *)local_98,(TransformerLogLin *)local_98._16_8_,
                   (ImDrawList *)(ulong)col,(pIVar10->NextItemData).LineWeight,col_00);
        break;
      case 2:
        local_98._0_4_ = iVar4;
        RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLog>
                  ((ImPlot *)getter,(GetterFuncPtr *)local_98,(TransformerLinLog *)local_98._16_8_,
                   (ImDrawList *)(ulong)col,(pIVar10->NextItemData).LineWeight,col_00);
        break;
      case 3:
        local_98._0_4_ = iVar4;
        RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLogLog>
                  (getter,(TransformerLogLog *)local_98,(ImDrawList *)local_98._16_8_,
                   (pIVar10->NextItemData).LineWeight,col);
      }
    }
    if ((pIVar10->NextItemData).Marker != -1) {
      PopPlotClipRect();
      PushPlotClipRect((pIVar10->NextItemData).MarkerSize);
      local_98._12_4_ = ImGui::GetColorU32((pIVar10->NextItemData).Colors + 2);
      local_98._8_4_ = ImGui::GetColorU32((pIVar10->NextItemData).Colors + 3);
      pIVar8 = GImPlot;
      dVar23 = (double)CONCAT44(in_XMM1_Dd,in_XMM1_Dc);
      dVar19 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
      transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
      lVar11 = (long)transformer.YAxis;
      switch(GImPlot->Scales[lVar11]) {
      case 0:
        iVar4 = getter->Count;
        if (0 < iVar4) {
          local_48.x = (double)getter->Getter;
          local_50 = (_func_ImPlotPoint_void_ptr_int *)getter->Data;
          local_58 = (void *)(ulong)(uint)getter->Offset;
          local_68 = CONCAT44(local_68._4_4_,(pIVar10->NextItemData).MarkerSize);
          fVar1 = (pIVar10->NextItemData).MarkerWeight;
          local_70 = (long)(pIVar10->NextItemData).Marker;
          iVar12 = 0;
          local_60 = lVar11 << 4;
          local_78 = CONCAT44(local_78._4_4_,(uint)(pIVar10->NextItemData).RenderMarkerLine);
          bVar9 = (pIVar10->NextItemData).RenderMarkerFill;
          do {
            dVar23 = (double)(*(code *)local_48.x)
                                       (local_50,(long)(((int)local_58 + iVar12) % iVar4 + iVar4) %
                                                 (long)iVar4 & 0xffffffff);
            uVar2 = *(undefined8 *)((long)&GImPlot->PixelRange[0].Min.x + local_60);
            dVar23 = GImPlot->Mx * (dVar23 - (GImPlot->CurrentPlot->XAxis).Range.Min) +
                     (double)(float)uVar2;
            fVar17 = (float)dVar23;
            fVar18 = (float)(GImPlot->My[lVar11] *
                             (dVar19 - GImPlot->CurrentPlot->YAxis[lVar11].Range.Min) +
                            (double)(float)((ulong)uVar2 >> 0x20));
            local_98._0_8_ = CONCAT44(fVar18,fVar17);
            pIVar6 = pIVar8->CurrentPlot;
            dVar19 = dVar23;
            if ((pIVar6->PlotRect).Min.x <= fVar17) {
              dVar19 = (double)CONCAT44(fVar18,fVar18);
              if ((((pIVar6->PlotRect).Min.y <= fVar18) &&
                  (dVar19 = (double)CONCAT44(fVar18,fVar18), fVar17 < (pIVar6->PlotRect).Max.x)) &&
                 (dVar19 = (double)CONCAT44(fVar18,fVar18), fVar18 < (pIVar6->PlotRect).Max.y)) {
                uVar20 = 0;
                fVar17 = fVar1;
                (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterFuncPtr>(ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                             ::marker_table + local_70 * 8))
                          ((undefined4)local_68,local_98._16_8_,local_98,local_78 & 0xffffffff,
                           local_98._12_4_,bVar9,local_98._8_4_);
                dVar19 = (double)CONCAT44(uVar20,fVar17);
              }
            }
            iVar12 = iVar12 + 1;
          } while (iVar4 != iVar12);
        }
        break;
      case 1:
        iVar4 = getter->Count;
        if (0 < iVar4) {
          local_50 = getter->Getter;
          local_58 = getter->Data;
          local_60 = (ulong)(uint)getter->Offset;
          fVar1 = (pIVar10->NextItemData).MarkerSize;
          local_70 = CONCAT44(local_70._4_4_,(pIVar10->NextItemData).MarkerWeight);
          local_78 = (ulong)(pIVar10->NextItemData).Marker;
          iVar12 = 0;
          local_68 = lVar11 << 4;
          local_7c = (uint)(pIVar10->NextItemData).RenderMarkerLine;
          local_80 = (uint)(pIVar10->NextItemData).RenderMarkerFill;
          do {
            IVar28.x = (*local_50)(local_58,(((int)local_60 + iVar12) % iVar4 + iVar4) % iVar4);
            pIVar10 = GImPlot;
            local_48.y._0_4_ = SUB84(dVar23,0);
            local_48.x = dVar19;
            local_48.y._4_4_ = (int)((ulong)dVar23 >> 0x20);
            dVar19 = log10((double)IVar28.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar6 = pIVar10->CurrentPlot;
            dVar23 = (pIVar6->XAxis).Range.Min;
            uVar2 = *(undefined8 *)((long)&pIVar10->PixelRange[0].Min.x + local_68);
            dVar19 = pIVar10->Mx *
                     (((double)(float)(dVar19 / pIVar10->LogDenX) *
                       ((pIVar6->XAxis).Range.Max - dVar23) + dVar23) - dVar23) +
                     (double)(float)uVar2;
            dVar23 = pIVar10->My[lVar11] * (local_48.x - pIVar6->YAxis[lVar11].Range.Min) +
                     (double)(float)((ulong)uVar2 >> 0x20);
            fVar17 = (float)dVar19;
            fVar18 = (float)dVar23;
            local_98._0_8_ = CONCAT44(fVar18,fVar17);
            pIVar6 = pIVar8->CurrentPlot;
            if ((pIVar6->PlotRect).Min.x <= fVar17) {
              dVar19 = (double)CONCAT44(fVar18,fVar18);
              dVar23 = (double)CONCAT44(fVar18,fVar18);
              if ((((pIVar6->PlotRect).Min.y <= fVar18) &&
                  (dVar19 = (double)CONCAT44(fVar18,fVar18),
                  dVar23 = (double)CONCAT44(fVar18,fVar18), fVar17 < (pIVar6->PlotRect).Max.x)) &&
                 (dVar19 = (double)CONCAT44(fVar18,fVar18), dVar23 = (double)CONCAT44(fVar18,fVar18)
                 , fVar18 < (pIVar6->PlotRect).Max.y)) {
                uVar21 = 0;
                uVar22 = 0;
                uVar24 = 0;
                uVar20 = (float)local_70;
                (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterFuncPtr>(ImPlot::GetterFuncPtr,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                             ::marker_table + local_78 * 8))
                          (fVar1,local_98._16_8_,local_98,local_7c,local_98._12_4_,local_80,
                           local_98._8_4_);
                dVar23 = (double)CONCAT44(uVar24,uVar22);
                dVar19 = (double)CONCAT44(uVar21,uVar20);
              }
            }
            iVar12 = iVar12 + 1;
          } while (iVar4 != iVar12);
        }
        break;
      case 2:
        iVar4 = getter->Count;
        if (0 < iVar4) {
          local_50 = getter->Getter;
          local_58 = getter->Data;
          local_60 = (ulong)(uint)getter->Offset;
          fVar1 = (pIVar10->NextItemData).MarkerSize;
          local_70 = CONCAT44(local_70._4_4_,(pIVar10->NextItemData).MarkerWeight);
          local_78 = (ulong)(pIVar10->NextItemData).Marker;
          iVar12 = 0;
          local_68 = lVar11 << 4;
          local_7c = (uint)(pIVar10->NextItemData).RenderMarkerLine;
          local_80 = (uint)(pIVar10->NextItemData).RenderMarkerFill;
          do {
            local_48.x = (double)(*local_50)(local_58,(((int)local_60 + iVar12) % iVar4 + iVar4) %
                                                      iVar4);
            pIVar10 = GImPlot;
            local_48.y._0_4_ = extraout_XMM0_Dc;
            local_48.y._4_4_ = extraout_XMM0_Dd;
            dVar23 = log10((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) /
                           GImPlot->CurrentPlot->YAxis[lVar11].Range.Min);
            pIVar6 = pIVar10->CurrentPlot;
            dVar19 = pIVar6->YAxis[lVar11].Range.Min;
            uVar2 = *(undefined8 *)((long)&pIVar10->PixelRange[0].Min.x + local_68);
            fVar17 = (float)(pIVar10->Mx * (local_48.x - (pIVar6->XAxis).Range.Min) +
                            (double)(float)uVar2);
            fVar18 = (float)(pIVar10->My[lVar11] *
                             (((double)(float)(dVar23 / pIVar10->LogDenY[lVar11]) *
                               (pIVar6->YAxis[lVar11].Range.Max - dVar19) + dVar19) - dVar19) +
                            (double)(float)((ulong)uVar2 >> 0x20));
            local_98._0_8_ = CONCAT44(fVar18,fVar17);
            pIVar6 = pIVar8->CurrentPlot;
            in_XMM1_Da = SUB84(dVar19,0);
            in_XMM1_Db = (float)((ulong)dVar19 >> 0x20);
            if (((((pIVar6->PlotRect).Min.x <= fVar17) &&
                 (in_XMM1_Da = fVar18, in_XMM1_Db = fVar18, (pIVar6->PlotRect).Min.y <= fVar18)) &&
                (fVar17 < (pIVar6->PlotRect).Max.x)) && (fVar18 < (pIVar6->PlotRect).Max.y)) {
              in_XMM1_Db = 0.0;
              in_XMM1_Da = (float)local_70;
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterFuncPtr>(ImPlot::GetterFuncPtr,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_78 * 8))
                        (fVar1,local_98._16_8_,local_98,local_7c,local_98._12_4_,local_80,
                         local_98._8_4_);
            }
            iVar12 = iVar12 + 1;
          } while (iVar4 != iVar12);
        }
        break;
      case 3:
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterFuncPtr>
                  (*getter,transformer,(ImDrawList *)local_98._16_8_,(pIVar10->NextItemData).Marker,
                   (pIVar10->NextItemData).MarkerSize,(pIVar10->NextItemData).RenderMarkerLine,
                   local_98._12_4_,(pIVar10->NextItemData).MarkerWeight,
                   (pIVar10->NextItemData).RenderMarkerFill,local_98._8_4_);
      }
    }
    pIVar10 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar10->NextItemData);
    pIVar10->PreviousItem = pIVar10->CurrentItem;
    pIVar10->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStairsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderStairs(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderStairs(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderStairs(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderStairs(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}